

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

Error asmjit::_abi_1_10::x86::Emitter_emitArgsAssignment
                (BaseEmitter *emitter,FuncFrame *frame,FuncArgsAssignment *args)

{
  bool avxEnabled;
  Error EVar1;
  BaseEmitter *in_RDI;
  EmitHelper emitHelper;
  FuncArgsAssignment *in_stack_000005a8;
  FuncFrame *in_stack_000005b0;
  BaseEmitHelper *in_stack_000005b8;
  undefined1 in_stack_ffffffffffffffc6;
  EmitHelper *in_stack_ffffffffffffffd0;
  
  avxEnabled = FuncFrame::isAvxEnabled((FuncFrame *)0x18aca7);
  FuncFrame::isAvx512Enabled((FuncFrame *)0x18acb5);
  EmitHelper::EmitHelper
            (in_stack_ffffffffffffffd0,in_RDI,avxEnabled,(bool)in_stack_ffffffffffffffc6);
  EVar1 = BaseEmitHelper::emitArgsAssignment(in_stack_000005b8,in_stack_000005b0,in_stack_000005a8);
  return EVar1;
}

Assistant:

static Error ASMJIT_CDECL Emitter_emitArgsAssignment(BaseEmitter* emitter, const FuncFrame& frame, const FuncArgsAssignment& args) {
  EmitHelper emitHelper(emitter, frame.isAvxEnabled(), frame.isAvx512Enabled());
  return emitHelper.emitArgsAssignment(frame, args);
}